

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_WEB(effect_handler_context_t_conflict *context)

{
  wchar_t idx;
  wchar_t wVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  wchar_t wVar5;
  monster *pmVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  loc grid;
  
  idx = cave->mon_current;
  if (L'\0' < idx) {
    pmVar6 = cave_monster(cave,idx);
    context->ident = true;
    wVar1 = pmVar6->race->spell_power;
    wVar9 = (uint)(L'(' < wVar1) + (uint)(L'P' < wVar1) + L'\x01';
    iVar4 = (pmVar6->grid).y;
    if (iVar4 - wVar9 <= iVar4 + (uint)(L'(' < wVar1) + (uint)(L'P' < wVar1) + L'\x01') {
      iVar7 = (pmVar6->grid).x;
      wVar1 = iVar4 - wVar9;
      do {
        wVar8 = iVar7 - wVar9;
        if (wVar8 <= iVar7 + wVar9) {
          do {
            grid.y = wVar1;
            grid.x = wVar8;
            wVar5 = distance((loc_conflict)grid,pmVar6->grid);
            if (((wVar5 <= wVar9) && (_Var3 = square_in_bounds_fully(cave,grid), _Var3)) &&
               (_Var3 = square_iswebbable(cave,grid), _Var3)) {
              square_add_web(cave,grid);
            }
            iVar7 = (pmVar6->grid).x;
            bVar2 = wVar8 < iVar7 + wVar9;
            wVar8 = wVar8 + L'\x01';
          } while (bVar2);
          iVar4 = (pmVar6->grid).y;
        }
        bVar2 = wVar1 < iVar4 + wVar9;
        wVar1 = wVar1 + L'\x01';
      } while (bVar2);
    }
  }
  return L'\0' < idx;
}

Assistant:

bool effect_handler_WEB(effect_handler_context_t *context)
{
	int rad = 1;
	struct monster *mon = NULL;
	struct loc grid;

	/* Get the monster creating */
	if (cave->mon_current > 0) {
		mon = cave_monster(cave, cave->mon_current);
	} else {
		/* Player can't currently create webs */
		return false;
	}

	/* Always notice */
	context->ident = true;

	/* Increase the radius for higher spell power */
	if (mon->race->spell_power > 40) rad++;
	if (mon->race->spell_power > 80) rad++;

	/* Check within the radius for clear floor */
	for (grid.y = mon->grid.y - rad; grid.y <= mon->grid.y + rad; grid.y++) {
		for (grid.x = mon->grid.x - rad; grid.x <= mon->grid.x + rad; grid.x++){
			if (distance(grid, mon->grid) > rad ||
				!square_in_bounds_fully(cave, grid)) continue;

			/* Require a floor grid with no existing traps or glyphs */
			if (!square_iswebbable(cave, grid)) continue;

			/* Create a web */
			square_add_web(cave, grid);
		}
	}

	return true;
}